

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O2

int emit_reg_accessor(Function *fn,Pseudo *pseudo,uint discriminator)

{
  uint16_t uVar1;
  SymbolType SVar2;
  Constant *pCVar3;
  uint uVar4;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  int extraout_EAX_04;
  int extraout_EAX_05;
  undefined4 in_register_00000014;
  undefined8 uVar5;
  ulong uVar6;
  char *pcVar7;
  
  uVar5 = CONCAT44(in_register_00000014,discriminator);
  if (2 < discriminator) {
    __assert_fail("discriminator == 0 || discriminator == 1 || discriminator == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/codegen.c"
                  ,0x3ee,"int emit_reg_accessor(Function *, const Pseudo *, unsigned int)");
  }
  switch(*(uint *)pseudo & 0xf) {
  case 0:
    SVar2 = ((pseudo->field_3).symbol)->symbol_type;
    if (SVar2 == SYM_UPVALUE) {
      uVar6 = (ulong)*(ushort *)((long)&((pseudo->field_3).symbol)->field_1 + 0x20);
      pcVar7 = "cl->upvals[%d]->v";
      goto LAB_0011e095;
    }
    if (SVar2 != SYM_LOCAL) {
      pcVar7 = "emit_reg_accessor: Unexpected pseudo symbol type";
      goto LAB_0011e134;
    }
  case 4:
  case 0xb:
  case 0xc:
    uVar4 = compute_register_from_base(fn,pseudo);
    pcVar7 = "R(%d)";
    uVar6 = (ulong)uVar4;
LAB_0011e095:
    raviX_buffer_add_fstring(&fn->body,pcVar7,uVar6);
    return extraout_EAX_02;
  case 1:
    pcVar7 = "&fval%u; fval%u.value_.n = ";
    break;
  case 2:
    pcVar7 = "&ival%u; ival%u.value_.i = ";
    break;
  case 3:
    pcVar7 = "&bval%u; bval%u.value_.b = ";
    break;
  case 5:
    pCVar3 = (pseudo->field_3).constant;
    uVar1 = pCVar3->type;
    if (uVar1 == 1) goto switchD_0011df6b_caseD_7;
    if (uVar1 == 7) {
      raviX_buffer_add_fstring
                (&fn->body,"&bval%u; bval%u.value_.b = %d",uVar5,(ulong)discriminator,
                 (ulong)*(uint *)&pCVar3->field_2);
      return extraout_EAX_03;
    }
    if (uVar1 == 8) {
      raviX_buffer_add_fstring
                (&fn->body,"&ival%u; ival%u.value_.i = %lld",uVar5,(ulong)discriminator,
                 (pCVar3->field_2).i);
      return extraout_EAX_04;
    }
    if (uVar1 == 0x10) {
      raviX_buffer_add_fstring(&fn->body,"&fval%u; fval%u.value_.n = ",uVar5,(ulong)discriminator);
      raviX_buffer_add_double(&fn->body,(((pseudo->field_3).constant)->field_2).n);
      return extraout_EAX_05;
    }
    if (uVar1 != 0x101) {
      pcVar7 = "emit_reg_accessor: Unexpected pseudo constant type";
      goto LAB_0011e134;
    }
    uVar6 = (ulong)pCVar3->index;
    pcVar7 = "K(%d)";
    goto LAB_0011e095;
  default:
    pcVar7 = "emit_reg_accessor: Unexpected pseudo type";
LAB_0011e134:
    handle_error_bad_pseudo(fn,pseudo,pcVar7);
  case 7:
switchD_0011df6b_caseD_7:
    raviX_buffer_add_string(&fn->body,"&nilval");
    return extraout_EAX_00;
  case 8:
    pcVar7 = "&bval%u; bval%u.value_.b = 1";
    goto LAB_0011e061;
  case 9:
    pcVar7 = "&bval%u; bval%u.value_.b = 0";
LAB_0011e061:
    raviX_buffer_add_fstring(&fn->body,pcVar7,uVar5,(ulong)discriminator);
    return extraout_EAX_01;
  case 0xd:
    uVar6 = (ulong)(pseudo->field_3).range_in_use;
    pcVar7 = "S(%d)";
    goto LAB_0011e095;
  }
  raviX_buffer_add_fstring(&fn->body,pcVar7,uVar5,(ulong)discriminator);
  emit_varname(fn,pseudo);
  return extraout_EAX;
}

Assistant:

static int emit_reg_accessor(Function *fn, const Pseudo *pseudo, unsigned discriminator)
{
	assert(discriminator == 0 || discriminator == 1 || discriminator == 2);
	if (pseudo->type == PSEUDO_LUASTACK) {
		// Note pseudo->stackidx is relative to ci->func
		// But ci->func is not always base-1 because of var args
		// Therefore we need a different way to compute these
		raviX_buffer_add_fstring(&fn->body, "S(%d)", pseudo->stackidx);
	} else if (pseudo->type == PSEUDO_TEMP_ANY || pseudo->type == PSEUDO_RANGE ||
		   pseudo->type == PSEUDO_RANGE_SELECT) {
		raviX_buffer_add_fstring(&fn->body, "R(%d)", compute_register_from_base(fn, pseudo));
	} else if (pseudo->type == PSEUDO_SYMBOL) {
		if (pseudo->symbol->symbol_type == SYM_LOCAL) {
			raviX_buffer_add_fstring(&fn->body, "R(%d)", compute_register_from_base(fn, pseudo));
		} else if (pseudo->symbol->symbol_type == SYM_UPVALUE) {
			raviX_buffer_add_fstring(&fn->body, "cl->upvals[%d]->v", pseudo->symbol->upvalue.upvalue_index);
		} else {
			handle_error_bad_pseudo(fn, pseudo, "emit_reg_accessor: Unexpected pseudo symbol type");
			return -1;
		}
	} else if (pseudo->type == PSEUDO_CONSTANT) {
		if (pseudo->constant->type == RAVI_TSTRING) {
			unsigned k = pseudo->constant->index;
			raviX_buffer_add_fstring(&fn->body, "K(%d)", k);
		} else if (pseudo->constant->type == RAVI_TNUMINT) {
			raviX_buffer_add_fstring(&fn->body, "&ival%u; ival%u.value_.i = %lld", discriminator,
						 discriminator, pseudo->constant->i);
		} else if (pseudo->constant->type == RAVI_TNUMFLT) {
			raviX_buffer_add_fstring(&fn->body, "&fval%u; fval%u.value_.n = ", discriminator,
						 discriminator);
			raviX_buffer_add_double(&fn->body, pseudo->constant->n);
		} else if (pseudo->constant->type == RAVI_TNIL) {
			raviX_buffer_add_string(&fn->body, "&nilval");
		} else if (pseudo->constant->type == RAVI_TBOOLEAN) {
			raviX_buffer_add_fstring(&fn->body, "&bval%u; bval%u.value_.b = %d", discriminator,
						 discriminator, (int)pseudo->constant->i);
		} else {
			handle_error_bad_pseudo(fn, pseudo, "emit_reg_accessor: Unexpected pseudo constant type");
			return -1;
		}
	} else if (pseudo->type == PSEUDO_TEMP_FLT) {
		raviX_buffer_add_fstring(&fn->body, "&fval%u; fval%u.value_.n = ", discriminator, discriminator);
		emit_varname(fn, pseudo);
	} else if (pseudo->type == PSEUDO_TEMP_INT) {
		raviX_buffer_add_fstring(&fn->body, "&ival%u; ival%u.value_.i = ", discriminator, discriminator);
		emit_varname(fn, pseudo);
	} else if (pseudo->type == PSEUDO_NIL) {
		raviX_buffer_add_string(&fn->body, "&nilval");
	} else if (pseudo->type == PSEUDO_TRUE) {
		raviX_buffer_add_fstring(&fn->body, "&bval%u; bval%u.value_.b = 1", discriminator, discriminator);
	} else if (pseudo->type == PSEUDO_FALSE) {
		raviX_buffer_add_fstring(&fn->body, "&bval%u; bval%u.value_.b = 0", discriminator, discriminator);
	} else if (pseudo->type == PSEUDO_TEMP_BOOL) {
		raviX_buffer_add_fstring(&fn->body, "&bval%u; bval%u.value_.b = ", discriminator, discriminator);
		emit_varname(fn, pseudo);
	} else {
		handle_error_bad_pseudo(fn, pseudo, "emit_reg_accessor: Unexpected pseudo type");
		return -1;
	}
	return 0;
}